

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O0

void bidfx_public_api::price::pixie::PriceUpdateDecoder::Visit
               (ByteBuffer *buffer,uint32_t size,IDataDictionary *data_dictionary,Syncable *syncable
               )

{
  Syncable *pSVar1;
  int iVar2;
  uint32_t sid_00;
  ostream *poVar3;
  invalid_argument *this;
  string local_270 [32];
  string local_250 [32];
  stringstream local_230 [8];
  stringstream err_msg;
  ostream local_220 [376];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  local_68;
  uint32_t local_34;
  char local_2d;
  uint32_t sid;
  char type;
  Syncable *pSStack_28;
  uint32_t i;
  Syncable *syncable_local;
  IDataDictionary *data_dictionary_local;
  ByteBuffer *pBStack_10;
  uint32_t size_local;
  ByteBuffer *buffer_local;
  
  pSStack_28 = syncable;
  syncable_local = (Syncable *)data_dictionary;
  data_dictionary_local._4_4_ = size;
  pBStack_10 = buffer;
  for (sid = 0; sid < data_dictionary_local._4_4_; sid = sid + 1) {
    iVar2 = (**(pBStack_10->super_InputStream)._vptr_InputStream)();
    local_2d = (char)iVar2;
    sid_00 = tools::Varint::ReadU32(&pBStack_10->super_InputStream);
    pSVar1 = pSStack_28;
    local_34 = sid_00;
    switch(local_2d) {
    case 'G':
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_230);
      poVar3 = std::operator<<(local_220,"unexpected price update type \'");
      poVar3 = std::operator<<(poVar3,local_2d);
      poVar3 = std::operator<<(poVar3,"\'");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cout,"[ERROR] ");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar3,local_250);
      std::__cxx11::string::~string(local_250);
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::invalid_argument::invalid_argument(this,local_270);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    case 'f':
      DecodePriceUpdate_abi_cxx11_
                (&local_68,(PriceUpdateDecoder *)pBStack_10,(ByteBuffer *)syncable_local,
                 (IDataDictionary *)&switchD_003111e6::switchdataD_00345950);
      (**pSVar1->_vptr_Syncable)(pSVar1,(ulong)sid_00,&local_68);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
      ::~map(&local_68);
      break;
    case 'g':
      break;
    case 'p':
      DecodePriceUpdate_abi_cxx11_
                (&local_a8,(PriceUpdateDecoder *)pBStack_10,(ByteBuffer *)syncable_local,
                 (IDataDictionary *)&switchD_003111e6::switchdataD_00345950);
      (*pSVar1->_vptr_Syncable[1])(pSVar1,(ulong)sid_00,&local_a8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
      ::~map(&local_a8);
      break;
    case 's':
      DecodePriceStatus(pBStack_10,sid_00,pSStack_28);
    }
  }
  return;
}

Assistant:

void PriceUpdateDecoder::Visit(ByteBuffer& buffer, uint32_t size, IDataDictionary& data_dictionary,
                               Syncable& syncable)
{
    for (uint32_t i = 0; i < size; i++)
    {
        const char type = buffer.ReadByte();
        uint32_t sid = Varint::ReadU32(buffer);
        switch (type)
        {
            case 'f': //FULL (image)
                syncable.PriceImage(sid, DecodePriceUpdate(buffer, data_dictionary));
                break;
            case 'p': // PARTIAL (update)
                syncable.PriceUpdate(sid, DecodePriceUpdate(buffer, data_dictionary));
                break;
            case 's': // STATUS
                DecodePriceStatus(buffer, sid, syncable);
                break;
            case 'G': // FULL GRID IMAGE
                // Grids not supported in cpp api
                break;
            case 'g': // GRID UPDATE
                // Grids not supported in cpp api
                break;
            default:
                std::stringstream err_msg;
                err_msg << "unexpected price update type '" << type << "'" << std::endl;
                std::cout << "[ERROR] " << err_msg.str();
                throw std::invalid_argument(err_msg.str());
        }
    }
}